

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

UnaryOp * __thiscall verilogAST::UnaryOp::clone_impl(UnaryOp *this)

{
  UnaryOp *this_00;
  pointer __fn;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_18;
  UnaryOp *local_10;
  UnaryOp *this_local;
  
  local_10 = this;
  this_00 = (UnaryOp *)operator_new(0x18);
  __fn = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
         operator->(&this->operand);
  Expression::clone((Expression *)&local_18,(__fn *)__fn,__child_stack,in_ECX,in_R8);
  UnaryOp(this_00,&local_18,this->op);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_18);
  return this_00;
}

Assistant:

virtual UnaryOp* clone_impl() const override {
    return new UnaryOp(this->operand->clone(), this->op);
  }